

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_octahedron_transform.cc
# Opt level: O0

bool __thiscall
draco::AttributeOctahedronTransform::GeneratePortableAttribute
          (AttributeOctahedronTransform *this,PointAttribute *attribute,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,int num_points,PointAttribute *target_attribute)

{
  bool bVar1;
  AttributeValueIndex AVar2;
  ulong uVar3;
  size_type sVar4;
  const_reference pvVar5;
  uint in_ECX;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  *in_RDX;
  int iVar6;
  PointAttribute *in_RSI;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  *in_RDI;
  GeometryAttribute *in_R8;
  int32_t t_1;
  int32_t s_1;
  AttributeValueIndex att_val_id_1;
  PointIndex i_1;
  int32_t t;
  int32_t s;
  AttributeValueIndex att_val_id;
  uint32_t i;
  OctahedronToolBox converter;
  int32_t dst_index;
  float att_val [3];
  int32_t *portable_attribute_data;
  PointAttribute *in_stack_ffffffffffffff48;
  PointAttribute *this_00;
  undefined8 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 local_90;
  AttributeValueIndex in_stack_ffffffffffffff74;
  uint local_80;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_7c;
  undefined4 local_78;
  undefined4 local_74;
  uint local_70;
  uint local_6c;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint uVar7;
  int32_t *in_stack_ffffffffffffffa0;
  float *in_stack_ffffffffffffffa8;
  int32_t in_stack_ffffffffffffffb0;
  int iVar8;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_3c;
  uint8_t *local_38;
  uint local_24;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  *local_20;
  PointAttribute *local_18;
  bool local_1;
  
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_3c,0);
  local_38 = GeometryAttribute::GetAddress(in_R8,(AttributeValueIndex)(uint)((ulong)in_RDI >> 0x20))
  ;
  iVar8 = 0;
  OctahedronToolBox::OctahedronToolBox((OctahedronToolBox *)&stack0xffffffffffffffa0);
  bVar1 = OctahedronToolBox::SetQuantizationBits
                    ((OctahedronToolBox *)&stack0xffffffffffffffa0,
                     *(int32_t *)
                      &(in_RDI->
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  if (bVar1) {
    bVar1 = std::
            vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
            ::empty(in_RDI);
    if (bVar1) {
      IndexType<unsigned_int,_draco::PointIndex_tag_type_>::IndexType(&local_7c,0);
      while( true ) {
        local_80 = local_24;
        bVar1 = IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator<(&local_7c,&local_80)
        ;
        if (!bVar1) break;
        AVar2 = PointAttribute::mapped_index
                          (in_stack_ffffffffffffff48,(uint)in_stack_ffffffffffffff50);
        GeometryAttribute::GetValue
                  ((GeometryAttribute *)
                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),AVar2,in_RDI);
        OctahedronToolBox::FloatVectorToQuantizedOctahedralCoords<float>
                  ((OctahedronToolBox *)CONCAT44(iVar8,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                   (int32_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        iVar6 = iVar8 + 1;
        *(undefined4 *)(local_38 + (long)iVar8 * 4) = local_90;
        iVar8 = iVar8 + 2;
        *(undefined4 *)(local_38 + (long)iVar6 * 4) = in_stack_ffffffffffffff6c;
        IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator++(&local_7c);
      }
    }
    else {
      uVar7 = 0;
      while( true ) {
        uVar3 = (ulong)uVar7;
        sVar4 = std::
                vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                ::size(local_20);
        if (sVar4 <= uVar3) break;
        this_00 = local_18;
        pvVar5 = std::
                 vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                 ::operator[](local_20,(ulong)uVar7);
        local_6c = pvVar5->value_;
        local_70 = (uint)PointAttribute::mapped_index(this_00,(PointIndex)(uint)uVar3);
        AVar2 = (AttributeValueIndex)local_70;
        GeometryAttribute::GetValue
                  ((GeometryAttribute *)
                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   in_stack_ffffffffffffff74,in_RDI);
        OctahedronToolBox::FloatVectorToQuantizedOctahedralCoords<float>
                  ((OctahedronToolBox *)CONCAT44(iVar8,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                   (int32_t *)CONCAT44(uVar7,AVar2.value_));
        iVar6 = iVar8 + 1;
        *(undefined4 *)(local_38 + (long)iVar8 * 4) = local_74;
        iVar8 = iVar8 + 2;
        *(undefined4 *)(local_38 + (long)iVar6 * 4) = local_78;
        uVar7 = uVar7 + 1;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool AttributeOctahedronTransform::GeneratePortableAttribute(
    const PointAttribute &attribute, const std::vector<PointIndex> &point_ids,
    int num_points, PointAttribute *target_attribute) const {
  DRACO_DCHECK(is_initialized());

  // Quantize all values in the order given by point_ids into portable
  // attribute.
  int32_t *const portable_attribute_data = reinterpret_cast<int32_t *>(
      target_attribute->GetAddress(AttributeValueIndex(0)));
  float att_val[3];
  int32_t dst_index = 0;
  OctahedronToolBox converter;
  if (!converter.SetQuantizationBits(quantization_bits_)) {
    return false;
  }
  if (!point_ids.empty()) {
    for (uint32_t i = 0; i < point_ids.size(); ++i) {
      const AttributeValueIndex att_val_id =
          attribute.mapped_index(point_ids[i]);
      attribute.GetValue(att_val_id, att_val);
      // Encode the vector into a s and t octahedral coordinates.
      int32_t s, t;
      converter.FloatVectorToQuantizedOctahedralCoords(att_val, &s, &t);
      portable_attribute_data[dst_index++] = s;
      portable_attribute_data[dst_index++] = t;
    }
  } else {
    for (PointIndex i(0); i < num_points; ++i) {
      const AttributeValueIndex att_val_id = attribute.mapped_index(i);
      attribute.GetValue(att_val_id, att_val);
      // Encode the vector into a s and t octahedral coordinates.
      int32_t s, t;
      converter.FloatVectorToQuantizedOctahedralCoords(att_val, &s, &t);
      portable_attribute_data[dst_index++] = s;
      portable_attribute_data[dst_index++] = t;
    }
  }

  return true;
}